

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MPSegment::Cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *words,
          size_t max_word_len)

{
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_RCX;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_RDX;
  const_iterator in_RSI;
  const_iterator in_RDI;
  MPSegment *unaff_retaddr;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_stack_ffffffffffffff98;
  RuneStr *begin_00;
  DictTrie *in_stack_ffffffffffffffb0;
  RuneStr local_40;
  const_iterator begin_01;
  
  begin_00 = &local_40;
  begin_01 = in_RDI;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)0x161616);
  DictTrie::Find(in_stack_ffffffffffffffb0,begin_00,in_RDI,in_stack_ffffffffffffff98,0x161638);
  CalcDP(unaff_retaddr,(vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)begin_01);
  CutByDag(unaff_retaddr,begin_01,in_RSI,in_RDX,in_RCX);
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin,
           RuneStrArray::const_iterator end,
           vector<WordRange>& words,
           size_t max_word_len = MAX_WORD_LENGTH) const {
    vector<Dag> dags;
    dictTrie_->Find(begin, 
          end, 
          dags,
          max_word_len);
    CalcDP(dags);
    CutByDag(begin, end, dags, words);
  }